

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O1

void lysc_unres_dflt_free(ly_ctx *ctx,lysc_unres_dflt *r)

{
  ulong uVar1;
  lysp_qname *plVar2;
  uint64_t c__;
  ulong uVar3;
  long lVar4;
  
  plVar2 = r->dflt;
  if (plVar2 == (lysp_qname *)0x0) {
LAB_00144e94:
    lVar4 = 0;
    uVar3 = 0;
    while( true ) {
      plVar2 = r->dflts;
      if (plVar2 == (lysp_qname *)0x0) {
        uVar1 = 0;
      }
      else {
        uVar1 = *(ulong *)&plVar2[-1].flags;
      }
      if (uVar1 <= uVar3) break;
      lysp_qname_free(ctx,(lysp_qname *)((long)&plVar2->str + lVar4));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x18;
    }
    if (plVar2 == (lysp_qname *)0x0) goto LAB_00144ed5;
    plVar2 = (lysp_qname *)&plVar2[-1].flags;
  }
  else {
    if (r->dflts != (lysp_qname *)0x0) {
      __assert_fail("!r->dflt || !r->dflts",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                    ,0xd1,
                    "void lysc_unres_dflt_free(const struct ly_ctx *, struct lysc_unres_dflt *)");
    }
    if (plVar2 == (lysp_qname *)0x0) goto LAB_00144e94;
    lysp_qname_free(ctx,plVar2);
    plVar2 = r->dflt;
  }
  free(plVar2);
LAB_00144ed5:
  free(r);
  return;
}

Assistant:

static void
lysc_unres_dflt_free(const struct ly_ctx *ctx, struct lysc_unres_dflt *r)
{
    assert(!r->dflt || !r->dflts);
    if (r->dflt) {
        lysp_qname_free((struct ly_ctx *)ctx, r->dflt);
        free(r->dflt);
    } else {
        FREE_ARRAY((struct ly_ctx *)ctx, r->dflts, lysp_qname_free);
    }
    free(r);
}